

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_count_scanner.cpp
# Opt level: O3

void __thiscall duckdb::ColumnCountScanner::FinalizeChunkProcess(ColumnCountScanner *this)

{
  ColumnCountResult *result;
  shared_ptr<duckdb::CSVBufferHandle,_true> *this_00;
  map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
  *this_01;
  CSVState CVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  __pthread_internal_list *p_Var2;
  __pthread_internal_list *p_Var3;
  CSVReaderOptions *this_03;
  undefined8 uVar4;
  bool bVar5;
  CSVBufferHandle *__tmp;
  CSVBufferHandle *pCVar6;
  CSVBufferManager *pos;
  _Head_base<0UL,_duckdb::CSVFileHandle_*,_false> _Var7;
  mapped_type *this_04;
  idx_t iVar8;
  CSVErrorHandler *this_05;
  LinesPerBoundary error_info;
  bool mock;
  LinesPerBoundary lines_per_batch;
  string csv_row;
  CSVError error;
  string *in_stack_fffffffffffffeb0;
  bool local_141;
  LinePosition *local_140;
  CSVIterator *local_138;
  shared_ptr<duckdb::CSVBufferManager,_true> *local_130;
  LinesPerBoundary local_128;
  string local_118;
  undefined1 local_f8 [32];
  _Alloc_hider local_d8;
  char local_c8 [32];
  _Alloc_hider local_a8;
  shared_ptr<duckdb::CSVBuffer,_true> local_98 [3];
  undefined1 local_68 [56];
  
  if ((((this->result).result_position != (this->result).super_ScannerResult.result_size) &&
      ((this->result).error == false)) &&
     (bVar5 = BaseScanner::FinishedFile(&this->super_BaseScanner), !bVar5)) {
    result = &this->result;
    local_138 = &(this->super_BaseScanner).iterator;
    this_00 = &(this->super_BaseScanner).cur_buffer_handle;
    local_130 = &(this->super_BaseScanner).buffer_manager;
    this_01 = &(this->result).buffer_handles;
    local_140 = &(this->result).super_ScannerResult.last_position;
    do {
      if ((this->result).super_ScannerResult.result_size <= (this->result).result_position) {
        return;
      }
      if ((this->result).error != false) {
        return;
      }
      iVar8 = (this->super_BaseScanner).iterator.pos.buffer_pos;
      pCVar6 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
      if (iVar8 == pCVar6->actual_size) {
        pos = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(local_130);
        (this->super_BaseScanner).iterator.pos.buffer_idx =
             (this->super_BaseScanner).iterator.pos.buffer_idx + 1;
        CSVBufferManager::GetBuffer((CSVBufferManager *)local_f8,(idx_t)pos);
        uVar4 = local_f8._8_8_;
        _Var7._M_head_impl = (CSVFileHandle *)local_f8._0_8_;
        local_f8._0_8_ = (CSVFileHandle *)0x0;
        local_f8._8_8_ = (ClientContext *)0x0;
        (this->super_BaseScanner).cur_buffer_handle.internal.
        super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)_Var7._M_head_impl;
        this_02 = (this->super_BaseScanner).cur_buffer_handle.internal.
                  super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        (this->super_BaseScanner).cur_buffer_handle.internal.
        super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
        if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
          if ((ClientContext *)local_f8._8_8_ != (ClientContext *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
          }
          _Var7._M_head_impl =
               (CSVFileHandle *)
               (this_00->internal).
               super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        if (_Var7._M_head_impl == (CSVFileHandle *)0x0) {
          (this->super_BaseScanner).buffer_handle_ptr = (char *)0x0;
          CVar1 = (this->super_BaseScanner).states.states[1];
          if (CVar1 < 0xd) {
            if ((0x860U >> (CVar1 & 0x1f) & 1) != 0) {
              return;
            }
            if ((0x1080U >> (CVar1 & 0x1f) & 1) != 0) {
              if ((this->super_BaseScanner).states.states[0] != UNQUOTED) {
                (this->result).error = true;
                return;
              }
              if (CVar1 == NOT_SET) {
                return;
              }
            }
          }
          if ((this->result).super_ScannerResult.comment == true) {
            ColumnCountResult::UnsetComment(result,0xffffffffffffffff);
            return;
          }
          ColumnCountResult::AddRow(result,0xffffffffffffffff);
          return;
        }
        this_04 = ::std::
                  map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
                  ::operator[](this_01,(key_type *)local_138);
        shared_ptr<duckdb::CSVBufferHandle,_true>::operator=(this_04,this_00);
        (this->result).cur_buffer_idx = (this->super_BaseScanner).iterator.pos.buffer_idx;
        pCVar6 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
        p_Var2 = (__pthread_internal_list *)pCVar6->actual_size;
        (this->result).current_buffer_size = (idx_t)p_Var2;
        p_Var3 = (__pthread_internal_list *)(this->result).cur_buffer_idx;
        LinesPerBoundary::LinesPerBoundary(&local_128);
        if ((__pthread_internal_list *)(this->result).super_ScannerResult.last_position.buffer_idx
            == p_Var3) {
          iVar8 = 0;
        }
        else {
          iVar8 = (this->result).super_ScannerResult.last_position.buffer_size;
        }
        if ((((this->result).super_ScannerResult.state_machine)->options->maximum_line_size).value <
            iVar8 - (this->result).super_ScannerResult.last_position.buffer_pos) {
          local_68._16_8_ = local_140->buffer_idx;
          local_68._0_8_ = local_140->buffer_pos;
          local_68._8_8_ = local_140->buffer_size;
          local_68._24_8_ = 0;
          local_141 = false;
          local_68._32_8_ = p_Var2;
          local_68._40_8_ = p_Var3;
          FullLinePosition::
          ReconstructCurrentLine<std::map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
                    (&local_118,(FullLinePosition *)local_68,&local_141,this_01,true);
          this_03 = ((this->result).super_ScannerResult.state_machine)->options;
          error_info.lines_in_batch = (idx_t)&local_118;
          error_info.boundary_idx = local_128.lines_in_batch;
          CSVError::LineSizeError
                    ((CSVError *)local_f8,(CSVError *)this_03,
                     (CSVReaderOptions *)local_128.boundary_idx,error_info,
                     (string *)
                     ((this->result).super_ScannerResult.last_position.buffer_idx *
                      (this_03->buffer_size_option).value +
                     (this->result).super_ScannerResult.last_position.buffer_pos),
                     (idx_t)&this_03->file_path,in_stack_fffffffffffffeb0);
          this_05 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                              (&(this->super_BaseScanner).error_handler);
          CSVErrorHandler::Error(this_05,(CSVError *)local_f8,false);
          (this->result).error = true;
          if ((shared_ptr<duckdb::CSVBuffer,_true> *)local_a8._M_p != local_98) {
            operator_delete(local_a8._M_p);
          }
          if (local_d8._M_p != local_c8) {
            operator_delete(local_d8._M_p);
          }
          if ((CSVFileHandle *)local_f8._0_8_ != (CSVFileHandle *)(local_f8 + 0x10)) {
            operator_delete((void *)local_f8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p == &local_118.field_2) {
            return;
          }
          operator_delete(local_118._M_dataplus._M_p);
          return;
        }
        if (2 < (this->result).buffer_handles._M_t._M_impl.super__Rb_tree_header._M_node_count) {
          ::std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
          ::_M_erase_aux(&this_01->_M_t,
                         (this->result).buffer_handles._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_left);
        }
        (this->super_BaseScanner).iterator.pos.buffer_pos = 0;
        pCVar6 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(pCVar6->handle).node);
        (this->super_BaseScanner).buffer_handle_ptr = (char *)((pCVar6->handle).node.ptr)->buffer;
      }
      BaseScanner::Process<duckdb::ColumnCountResult>(&this->super_BaseScanner,result);
      bVar5 = BaseScanner::FinishedFile(&this->super_BaseScanner);
    } while (!bVar5);
  }
  return;
}

Assistant:

void ColumnCountScanner::FinalizeChunkProcess() {
	if (result.result_position == result.result_size || result.error) {
		// We are done
		return;
	}
	// We run until we have a full chunk, or we are done scanning
	while (!FinishedFile() && result.result_position < result.result_size && !result.error) {
		if (iterator.pos.buffer_pos == cur_buffer_handle->actual_size) {
			// Move to next buffer
			cur_buffer_handle = buffer_manager->GetBuffer(++iterator.pos.buffer_idx);

			if (!cur_buffer_handle) {
				buffer_handle_ptr = nullptr;
				if (states.IsQuotedCurrent() && !states.IsUnquoted()) {
					// We are finishing our file on a quoted value that is never unquoted, straight to jail.
					result.error = true;
					return;
				}
				if (states.EmptyLine() || states.NewRow() || states.IsCurrentNewRow() || states.IsNotSet()) {
					return;
				}
				// This means we reached the end of the file, we must add a last line if there is any to be added
				if (result.comment) {
					// If it's a comment we add the last line via unset comment
					result.UnsetComment(result, NumericLimits<idx_t>::Maximum());
				} else {
					// OW, we do a regular AddRow
					result.AddRow(result, NumericLimits<idx_t>::Maximum());
				}
				return;
			} else {
				result.buffer_handles[iterator.pos.buffer_idx] = cur_buffer_handle;
				result.cur_buffer_idx = iterator.pos.buffer_idx;
				result.current_buffer_size = cur_buffer_handle->actual_size;
				// Do a quick check that the line is still sane
				const LinePosition cur_position(result.cur_buffer_idx, 0, result.current_buffer_size);
				LinesPerBoundary lines_per_batch;
				if (cur_position - result.last_position > result.state_machine.options.maximum_line_size.GetValue()) {
					FullLinePosition current_line_position;
					current_line_position.begin = result.last_position;
					current_line_position.end = cur_position;
					bool mock = false;
					string csv_row = current_line_position.ReconstructCurrentLine(mock, result.buffer_handles, true);
					auto error =
					    CSVError::LineSizeError(result.state_machine.options, lines_per_batch, csv_row,
					                            result.last_position.GetGlobalPosition(
					                                result.state_machine.options.buffer_size_option.GetValue(), false),
					                            result.state_machine.options.file_path);
					error_handler->Error(error);
					result.error = true;
					return;
				}
			}
			if (result.buffer_handles.size() > 2) {
				// pop lowest value
				result.buffer_handles.erase(result.buffer_handles.begin());
			}
			iterator.pos.buffer_pos = 0;
			buffer_handle_ptr = cur_buffer_handle->Ptr();
		}
		Process(result);
	}
}